

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyHttpImplPrivate::completeCacheSave(QNetworkReplyHttpImplPrivate *this)

{
  long *plVar1;
  long in_RDI;
  
  if (((*(byte *)(in_RDI + 0x2d0) & 1) == 0) || (*(int *)(in_RDI + 0x228) == 0)) {
    if (((*(byte *)(in_RDI + 0x2d0) & 1) != 0) && (*(long *)(in_RDI + 0x2c8) != 0)) {
      plVar1 = *(long **)(*(long *)(in_RDI + 0x238) + 0x78);
      (**(code **)(*plVar1 + 0x90))(plVar1,*(undefined8 *)(in_RDI + 0x2c8));
    }
  }
  else {
    plVar1 = *(long **)(*(long *)(in_RDI + 0x238) + 0x78);
    (**(code **)(*plVar1 + 0x78))(plVar1,in_RDI + 0x1e0);
  }
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined1 *)(in_RDI + 0x2d0) = 0;
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::completeCacheSave()
{
    if (cacheEnabled && errorCode != QNetworkReplyImpl::NoError) {
        managerPrivate->networkCache->remove(url);
    } else if (cacheEnabled && cacheSaveDevice) {
        managerPrivate->networkCache->insert(cacheSaveDevice);
    }
    cacheSaveDevice = nullptr;
    cacheEnabled = false;
}